

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  buffer<char> *pbVar5;
  int iVar6;
  result rVar7;
  long lVar8;
  decimal_fp<float> dVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t error;
  ulong uVar15;
  size_t __len;
  uint uVar16;
  ulong uVar17;
  decimal_fp<double> dVar18;
  int exp;
  fixed_handler handler;
  int local_7c;
  fixed_handler local_78;
  ulong local_60;
  buffer<char> *local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  uint64_t local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar15 = (ulong)specs & 0xff00000000;
  local_78.fixed = uVar15 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar15 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      local_7c = 0;
    }
    else {
      uVar15 = (ulong)(uint)precision;
      if (buf->capacity_ < uVar15) {
        (**buf->_vptr_buffer)(buf,uVar15);
      }
      uVar10 = buf->capacity_;
      if (uVar15 <= buf->capacity_) {
        uVar10 = uVar15;
      }
      buf->size_ = uVar10;
      memset(buf->ptr_,0x30,uVar15);
      local_7c = -precision;
    }
  }
  else {
    local_60 = (ulong)specs >> 0x20;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      iVar6 = snprintf_float<double>(value,precision,specs,buf);
      return iVar6;
    }
    if (precision < 0) {
      if ((specs._4_4_ >> 0x12 & 1) == 0) {
        dVar18 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar18.significand);
        local_7c = dVar18.exponent;
      }
      else {
        dVar9 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar9.significand);
        local_7c = dVar9.exponent;
      }
    }
    else {
      local_7c = 0;
      uVar13 = (ulong)value & 0xfffffffffffff;
      uVar10 = uVar13 | 0x10000000000000;
      iVar6 = (uint)((ulong)value >> 0x34) - 0x433;
      if ((ulong)value >> 0x34 == 0) {
        uVar10 = uVar13 << ((ulong)(byte)((char)LZCOUNT(uVar13) + 0x35) & 0x3f);
        iVar6 = -0x427 - (int)LZCOUNT(uVar13);
      }
      iVar4 = (int)((ulong)((long)(-0x32 - iVar6) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar12 = iVar4 + 0x15b;
      uVar16 = iVar4 + 0x162;
      if (-1 < (int)uVar12) {
        uVar16 = uVar12;
      }
      local_48 = (ulong)(uVar16 & 0xfffffff8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar10 << 0xb;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(basic_data<void>::grisu_pow10_significands +
                               (long)((int)uVar16 >> 3) * 8 + 8);
      uVar13 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
      uVar10 = (ulong)(-(*(short *)(basic_data<void>::grisu_pow10_exponents +
                                   (long)((int)uVar16 >> 3) * 2 + 2) + iVar6) - 0x35);
      local_78.precision = 0x2ff;
      if (precision < 0x2ff) {
        local_78.precision = precision;
      }
      local_78.buf = buf->ptr_;
      local_78.size = 0;
      local_78.exp10 = 0x154 - (uVar16 & 0xfffffff8);
      uVar17 = uVar13 >> (uVar10 & 0x3f);
      uVar16 = (uint)uVar17;
      if (uVar16 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      local_58 = buf;
      local_40 = value;
      if (uVar17 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      lVar8 = (ulong)*(ushort *)(bsr2log10(int)::data + (ulong)(LZCOUNT(uVar16 | 1) ^ 0x1f) * 2) -
              (ulong)(uVar16 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)*(ushort *)
                                                (bsr2log10(int)::data +
                                                (ulong)(LZCOUNT(uVar16 | 1) ^ 0x1f) * 2) * 4));
      local_7c = (int)lVar8;
      rVar7 = fixed_handler::on_start
                        (&local_78,
                         *(long *)(basic_data<void>::grisu_pow10_exponents + lVar8 * 8 + 0xa8) <<
                         (uVar10 & 0x3f),uVar13 / 10,10,&local_7c);
      if (rVar7 == more) {
        local_38 = 1L << (uVar10 & 0x3f);
        local_50 = local_38 - 1;
        uVar13 = uVar13 & local_50;
        do {
          lVar8 = (long)local_7c;
          switch(local_7c) {
          case 1:
            cVar11 = (char)uVar17;
            uVar17 = 0;
            goto LAB_0011c58e;
          case 2:
            cVar11 = (char)((uVar17 & 0xffffffff) / 10);
            iVar6 = (int)((uVar17 & 0xffffffff) / 10) * 10;
            break;
          case 3:
            cVar11 = (char)((uVar17 & 0xffffffff) / 100);
            iVar6 = (int)((uVar17 & 0xffffffff) / 100) * 100;
            break;
          case 4:
            cVar11 = (char)((uVar17 & 0xffffffff) / 1000);
            iVar6 = (int)((uVar17 & 0xffffffff) / 1000) * 1000;
            break;
          case 5:
            cVar11 = (char)((uVar17 & 0xffffffff) / 10000);
            iVar6 = (int)((uVar17 & 0xffffffff) / 10000) * 10000;
            break;
          case 6:
            uVar14 = uVar17 >> 5 & 0x7ffffff;
            cVar11 = (char)(uVar14 / 0xc35);
            iVar6 = (int)(uVar14 / 0xc35) * 100000;
            break;
          case 7:
            cVar11 = (char)((uVar17 & 0xffffffff) / 1000000);
            iVar6 = (int)((uVar17 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 8:
            cVar11 = (char)((uVar17 & 0xffffffff) / 10000000);
            iVar6 = (int)((uVar17 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 9:
            cVar11 = (char)((uVar17 & 0xffffffff) / 100000000);
            iVar6 = (int)((uVar17 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 10:
            uVar14 = (uVar17 >> 9 & 0x7fffff) * 0x44b83;
            cVar11 = (char)(uVar14 >> 0x27);
            iVar6 = (uint)(uVar14 >> 0x27) * 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          uVar17 = (ulong)(uint)((int)uVar17 - iVar6);
LAB_0011c58e:
          local_7c = local_7c + -1;
          rVar7 = fixed_handler::on_digit
                            (&local_78,cVar11 + '0',
                             *(long *)(basic_data<void>::grisu_pow10_exponents + lVar8 * 8 + 0xa8)
                             << (uVar10 & 0x3f),(uVar17 << (uVar10 & 0x3f)) + uVar13,1,local_7c,true
                            );
          if (rVar7 != more) goto LAB_0011c63f;
        } while (0 < local_7c);
        error = 1;
        do {
          uVar17 = uVar13 * 10;
          error = error * 10;
          uVar13 = uVar17 & local_50;
          local_7c = local_7c + -1;
          rVar7 = fixed_handler::on_digit
                            (&local_78,(char)(uVar17 >> (uVar10 & 0x3f)) + '0',local_38,uVar13,error
                             ,local_7c,false);
        } while (rVar7 == more);
      }
LAB_0011c63f:
      pbVar5 = local_58;
      uVar16 = (uint)local_60;
      if (rVar7 == error) {
        local_7c = (local_78.size - ((int)local_48 + 8)) + 0x15b + local_7c;
        fallback_format<double>
                  (local_40,local_78.precision,(bool)((byte)(uVar16 >> 0x12) & 1),local_58,&local_7c
                  );
      }
      else {
        local_7c = local_7c + local_78.exp10;
        uVar10 = (ulong)local_78.size;
        if ((long)uVar10 < 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        if (local_58->capacity_ < uVar10) {
          (**local_58->_vptr_buffer)(local_58,uVar10);
        }
        if (pbVar5->capacity_ < uVar10) {
          uVar10 = pbVar5->capacity_;
        }
        pbVar5->size_ = uVar10;
      }
      if ((uVar16 >> 0x14 & 1) == 0 && uVar15 != 0x200000000) {
        uVar15 = pbVar5->size_;
        if (uVar15 != 0) {
          do {
            iVar6 = local_7c + 1;
            if (pbVar5->ptr_[uVar15 - 1] != '0') goto LAB_0011c777;
            uVar15 = uVar15 - 1;
            local_7c = iVar6;
          } while (uVar15 != 0);
          uVar15 = 0;
        }
LAB_0011c777:
        if (pbVar5->capacity_ < uVar15) {
          (**pbVar5->_vptr_buffer)(pbVar5,uVar15);
        }
        if (pbVar5->capacity_ < uVar15) {
          uVar15 = pbVar5->capacity_;
        }
        pbVar5->size_ = uVar15;
      }
    }
  }
  return local_7c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}